

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

RandSequenceStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::RandSequenceStatement,slang::ast::RandSeqProductionSymbol_const*&,std::span<slang::ast::RandSeqProductionSymbol_const*,18446744073709551615ul>,slang::SourceRange>
          (BumpAllocator *this,RandSeqProductionSymbol **args,
          span<const_slang::ast::RandSeqProductionSymbol_*,_18446744073709551615UL> *args_1,
          SourceRange *args_2)

{
  RandSeqProductionSymbol *pRVar1;
  pointer ppRVar2;
  size_t sVar3;
  SourceLocation SVar4;
  SourceLocation SVar5;
  RandSequenceStatement *pRVar6;
  
  pRVar6 = (RandSequenceStatement *)allocate(this,0x38,8);
  pRVar1 = *args;
  ppRVar2 = args_1->_M_ptr;
  sVar3 = (args_1->_M_extent)._M_extent_value;
  SVar4 = args_2->startLoc;
  SVar5 = args_2->endLoc;
  (pRVar6->super_Statement).kind = RandSequence;
  (pRVar6->super_Statement).syntax = (StatementSyntax *)0x0;
  (pRVar6->super_Statement).sourceRange.startLoc = SVar4;
  (pRVar6->super_Statement).sourceRange.endLoc = SVar5;
  pRVar6->firstProduction = pRVar1;
  (pRVar6->productions)._M_ptr = ppRVar2;
  (pRVar6->productions)._M_extent._M_extent_value = sVar3;
  return pRVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }